

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O3

void __thiscall Graph::read_binary(Graph *this,string *_attribute_file,string *_graph_file)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  pointer puVar1;
  int *piVar2;
  iterator __position;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint *puVar3;
  long lVar4;
  pair<unsigned_int,_unsigned_int> *ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  char cVar8;
  VertexIdType VVar9;
  EdgeSizeType EVar10;
  Edge *edge;
  uint *puVar11;
  ulong uVar12;
  FILE *__stream;
  size_t sVar13;
  pointer pEVar14;
  pointer puVar15;
  ostream *poVar16;
  uint uVar17;
  uint uVar18;
  pointer puVar19;
  ulong uVar20;
  uint uVar21;
  VertexIdType *to_id;
  VertexIdType *__args;
  pointer pEVar22;
  double dVar23;
  vector<Edge,_std::allocator<Edge>_> edges;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_positions_to_fill;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  position_pair;
  vector<unsigned_int,_std::allocator<unsigned_int>_> in_positions_to_fill;
  ifstream attribute_file;
  vector<Edge,_std::allocator<Edge>_> local_2c8;
  pair<unsigned_int,_unsigned_int> *local_2a8 [2];
  pair<unsigned_int,_unsigned_int> local_298 [2];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_268;
  double local_260;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_258;
  void *local_250 [2];
  long local_240;
  undefined8 local_238;
  long local_228 [63];
  
  local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  std::ifstream::ifstream(&local_238,(string *)_attribute_file,_S_in);
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    printf("/workspace/llm4binary/github/license_c_cmakelists/wuhao-wu-jiang[P]Personalized-PageRank/Graph.h; LINE %d; File Not Exists.\n"
           ,0xa1);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(_attribute_file->_M_dataplus)._M_p,
                         _attribute_file->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar16);
    goto LAB_001085c5;
  }
  cVar8 = std::ios::widen((char)&local_238 + (char)*(undefined8 *)((long)local_238 + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_238,(string *)&local_2c8,cVar8);
  std::__cxx11::string::find((char)&local_2c8,0x3d);
  std::__cxx11::string::substr((ulong)local_2a8,(ulong)&local_2c8);
  ppVar5 = local_2a8[0];
  puVar11 = (uint *)__errno_location();
  uVar21 = *puVar11;
  *puVar11 = 0;
  uVar12 = strtoul((char *)ppVar5,(char **)&local_288,10);
  VVar9 = (VertexIdType)uVar12;
  if (local_288.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start == ppVar5) {
    std::__throw_invalid_argument("stoul");
LAB_00108592:
    _graph_file = (string *)(ulong)uVar21;
    std::__throw_invalid_argument("stoul");
  }
  else {
    if (*puVar11 == 0) {
LAB_00107ca9:
      *puVar11 = uVar21;
    }
    else if (*puVar11 == 0x22) {
      VVar9 = std::__throw_out_of_range("stoul");
      goto LAB_00107ca9;
    }
    this->numOfVertices = VVar9;
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0],(long)local_298[0] + 1);
    }
    cVar8 = std::ios::widen((char)(istream *)&local_238 +
                            (char)*(undefined8 *)((long)local_238 + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_238,(string *)&local_2c8,cVar8);
    std::__cxx11::string::find((char)&local_2c8,0x3d);
    std::__cxx11::string::substr((ulong)local_2a8,(ulong)&local_2c8);
    ppVar5 = local_2a8[0];
    uVar21 = *puVar11;
    *puVar11 = 0;
    uVar12 = strtoul((char *)local_2a8[0],(char **)&local_288,10);
    EVar10 = (EdgeSizeType)uVar12;
    if (local_288.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start == ppVar5) goto LAB_00108592;
    if (*puVar11 == 0) {
LAB_00107d69:
      *puVar11 = uVar21;
    }
    else if (*puVar11 == 0x22) {
      EVar10 = std::__throw_out_of_range("stoul");
      goto LAB_00107d69;
    }
    this->numOfEdges = EVar10;
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0],(long)local_298[0] + 1);
    }
    this->dummy_id = this->numOfVertices;
    printf("The Number of Vertices: %d\n");
    printf("The Number of Edges: %d\n",(ulong)this->numOfEdges);
    std::ifstream::close();
    std::ifstream::~ifstream(&local_238);
    if (local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        (pointer)&local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT71(local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._1_7_,
                               local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
    }
    local_260 = getCurrentTime();
    std::vector<Edge,_std::allocator<Edge>_>::vector
              (&local_2c8,(ulong)this->numOfEdges,(allocator_type *)&local_238);
    __stream = fopen((_graph_file->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      sVar13 = fread(local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_start,8,
                     (long)local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3,__stream);
      printf("Returned Value of fread: %zu\n",sVar13);
      fclose(__stream);
      getCurrentTime();
      printf("Time Used For Loading BINARY : %.2f\n");
      this->numOfEdges = 0;
      this_00 = &this->out_degrees;
      puVar15 = (this->out_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->out_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar15) {
        (this->out_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar15;
      }
      local_238._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (this_00,(ulong)(this->numOfVertices + 2),(value_type_conflict1 *)&local_238);
      puVar15 = (this->in_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      this_01 = &this->in_degrees;
      if ((this->in_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish != puVar15) {
        (this->in_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar15;
      }
      local_238._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (this_01,(ulong)(this->numOfVertices + 2),(value_type_conflict1 *)&local_238);
      if (local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        puVar15 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        puVar19 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        pEVar14 = local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if (pEVar14->from_id != pEVar14->to_id) {
            puVar1 = puVar15 + pEVar14->from_id;
            *puVar1 = *puVar1 + 1;
            puVar1 = puVar19 + pEVar14->to_id;
            *puVar1 = *puVar1 + 1;
            this->numOfEdges = this->numOfEdges + 1;
          }
          pEVar14 = pEVar14 + 1;
        } while (pEVar14 !=
                 local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      puVar15 = (this->deadend_vertices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->deadend_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar15) {
        (this->deadend_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar15;
      }
      local_238 = (long *)((ulong)local_238._4_4_ << 0x20);
      if (this->numOfVertices == 0) {
        uVar21 = 0;
        puVar19 = puVar15;
      }
      else {
        puVar15 = (this->out_degrees).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = 0;
        uVar21 = 0;
        do {
          if (puVar15[uVar12] == 0) {
            __position._M_current =
                 (this->deadend_vertices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->deadend_vertices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         &this->deadend_vertices,__position,(uint *)&local_238);
              puVar15 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            }
            else {
              *__position._M_current = (uint)uVar12;
              (this->deadend_vertices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          uVar20 = (ulong)local_238 & 0xffffffff;
          uVar17 = (value_type_conflict1)local_238 + 1;
          uVar12 = (ulong)uVar17;
          local_238 = (long *)CONCAT44(local_238._4_4_,uVar17);
          uVar18 = puVar15[uVar20];
          if (puVar15[uVar20] < uVar21) {
            uVar18 = uVar21;
          }
          uVar21 = uVar18;
        } while (uVar17 < this->numOfVertices);
        puVar15 = (this->deadend_vertices).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar19 = (this->deadend_vertices).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      this->num_deadend_vertices = (VertexIdType)((ulong)((long)puVar19 - (long)puVar15) >> 2);
      printf("The number of dead end vertices:%d\n");
      puVar15 = (this->start_pos_in_appearance_pos_lists).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->start_pos_in_appearance_pos_lists).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar15) {
        (this->start_pos_in_appearance_pos_lists).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar15;
      }
      local_238 = (long *)((ulong)local_238 & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->start_pos_in_appearance_pos_lists,(ulong)(this->numOfVertices + 2),
                 (value_type_conflict1 *)&local_238);
      uVar12 = (ulong)this->numOfVertices;
      puVar15 = (this->start_pos_in_appearance_pos_lists).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (1 < uVar12) {
        puVar19 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        uVar18 = *puVar15;
        uVar20 = 1;
        do {
          uVar18 = uVar18 + puVar19[uVar20 - 1];
          puVar15[uVar20] = uVar18;
          uVar20 = uVar20 + 1;
          uVar12 = (ulong)this->numOfVertices;
        } while (uVar20 < uVar12);
      }
      puVar15[uVar12] = this->numOfEdges;
      puVar15 = (this->start_pos_in_out_neighbor_lists).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->start_pos_in_out_neighbor_lists).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar15) {
        (this->start_pos_in_out_neighbor_lists).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar15;
      }
      local_238 = (long *)((ulong)local_238 & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->start_pos_in_out_neighbor_lists,(ulong)(this->numOfVertices + 2),
                 (value_type_conflict1 *)&local_238);
      puVar15 = (this->out_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      __first._M_current =
           (this->start_pos_in_out_neighbor_lists).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      if (this->numOfVertices - 1 < 0xfffffffe) {
        uVar18 = *__first._M_current;
        uVar12 = 1;
        do {
          uVar17 = puVar15[uVar12 - 1];
          uVar18 = uVar18 + uVar17 + (uint)(uVar17 == 0);
          __first._M_current[uVar12] = uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar12 < this->numOfVertices + 1);
      }
      puVar15[this->dummy_id] = 0;
      __first._M_current[this->numOfVertices + 1] = __first._M_current[this->numOfVertices];
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_2a8,__first,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(this->start_pos_in_out_neighbor_lists).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(allocator_type *)&local_238);
      local_268 = &this->out_neighbors_lists;
      puVar15 = (this->out_neighbors_lists).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->out_neighbors_lists).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar15) {
        (this->out_neighbors_lists).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar15;
      }
      local_238 = (long *)((ulong)local_238 & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (local_268,(ulong)(this->numOfEdges + uVar21 + this->num_deadend_vertices),
                 (value_type_conflict1 *)&local_238);
      local_288.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar17 = this->numOfEdges / 10;
      uVar18 = 1;
      if (1 < uVar17) {
        uVar18 = uVar17;
      }
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::reserve(&local_288,(ulong)this->numOfEdges);
      pEVar14 = local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar17 = 0;
        __args = &(local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                   super__Vector_impl_data._M_start)->to_id;
        do {
          if (((Edge *)(__args + -1))->from_id != *__args) {
            puVar11 = &local_2a8[0]->first + ((Edge *)(__args + -1))->from_id;
            (local_268->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[*puVar11] = *__args;
            std::
            vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
            ::emplace_back<unsigned_int_const&,unsigned_int&>
                      ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                        *)&local_288,__args,puVar11);
            uVar17 = uVar17 + 1;
            *puVar11 = *puVar11 + 1;
            if (uVar17 % uVar18 == 0) {
              printf("%u edges processed.\n",(ulong)uVar17);
            }
          }
          pEVar22 = (pointer)(__args + 1);
          __args = __args + 2;
        } while (pEVar22 != pEVar14);
        if (local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"edges_processed",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      local_238 = local_228;
      std::__cxx11::string::_M_construct((ulong)&local_238,'\x1e');
      puts((char *)local_238);
      if (local_238 != local_228) {
        operator_delete(local_238,local_228[0] + 1);
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_250,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(this->start_pos_in_appearance_pos_lists).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(this->start_pos_in_appearance_pos_lists).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(allocator_type *)&local_238);
      *(EdgeSizeType *)((long)local_250[0] + (ulong)this->numOfVertices * 4) = this->numOfEdges;
      getCurrentTime();
      ppVar7 = local_288.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar6 = local_288.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_288.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_288.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
                  (local_288.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_288.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (int)LZCOUNT((long)local_288.
                                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_288.
                                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
                  (ppVar6,ppVar7);
      }
      getCurrentTime();
      local_238 = local_228;
      std::__cxx11::string::_M_construct((ulong)&local_238,'\x1e');
      puts((char *)local_238);
      if (local_238 != local_228) {
        operator_delete(local_238,local_228[0] + 1);
      }
      local_258 = &this->appearance_pos_lists;
      puVar15 = (this->appearance_pos_lists).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->appearance_pos_lists).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar15) {
        (this->appearance_pos_lists).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar15;
      }
      local_238 = (long *)((ulong)local_238 & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (local_258,(ulong)(uVar21 + this->numOfEdges + this->num_deadend_vertices),
                 (value_type_conflict1 *)&local_238);
      ppVar7 = local_288.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar6 = local_288.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_288.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_288.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar12 = 0;
        do {
          uVar21 = ppVar6[uVar12].first;
          (local_258->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[*(uint *)((long)local_250[0] + (ulong)uVar21 * 4)] =
               ppVar6[uVar12].second;
          piVar2 = (int *)((long)local_250[0] + (ulong)uVar21 * 4);
          *piVar2 = *piVar2 + 1;
          if ((int)((uVar12 + 1 & 0xffffffff) % (ulong)uVar18) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"in_pos_pair",0xb);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
            std::ostream::put((char)poVar16);
            std::ostream::flush();
          }
          lVar4 = uVar12 + 1;
          uVar12 = uVar12 + 1;
        } while (ppVar6 + lVar4 != ppVar7);
      }
      puVar11 = (this->deadend_vertices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 = (this->deadend_vertices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar11 != puVar3) {
        puVar15 = (local_268->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          uVar21 = *puVar11;
          uVar18 = this->dummy_id;
          puVar11 = puVar11 + 1;
          uVar17 = (&local_2a8[0]->first)[uVar21];
          (&local_2a8[0]->first)[uVar21] = uVar17 + 1;
          puVar15[uVar17] = uVar18;
        } while (puVar11 != puVar3);
      }
      dVar23 = getCurrentTime();
      printf("Graph Build Finished. TIME: %.4f\n",dVar23 - local_260);
      local_238 = local_228;
      std::__cxx11::string::_M_construct((ulong)&local_238,'n');
      puts((char *)local_238);
      if (local_238 != local_228) {
        operator_delete(local_238,local_228[0] + 1);
      }
      if (local_250[0] != (void *)0x0) {
        operator_delete(local_250[0],local_240 - (long)local_250[0]);
      }
      if (local_288.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_288.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2a8[0] != (pair<unsigned_int,_unsigned_int> *)0x0) {
        operator_delete(local_2a8[0],(long)local_298[0] - (long)local_2a8[0]);
      }
      if (local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        CONCAT71(local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._1_7_,
                                 local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._0_1_) -
                        (long)local_2c8.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  puts("Graph::read; File Not Exists.");
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(_graph_file->_M_dataplus)._M_p,
                       _graph_file->_M_string_length);
  std::endl<char,std::char_traits<char>>(poVar16);
LAB_001085c5:
  exit(1);
}

Assistant:

void read_binary(const std::string &_attribute_file,
                     const std::string &_graph_file) {
        {
            std::string line;
            std::ifstream attribute_file(_attribute_file);
            if (attribute_file.is_open()) {
                std::getline(attribute_file, line);
                size_t start1 = line.find_first_of('=');
                numOfVertices = std::stoul(line.substr(start1 + 1));
                std::getline(attribute_file, line);
                size_t start2 = line.find_first_of('=');
                numOfEdges = std::stoul(line.substr(start2 + 1));
                dummy_id = numOfVertices;
                printf("The Number of Vertices: %d\n", numOfVertices);
                printf("The Number of Edges: %d\n", numOfEdges);
                attribute_file.close();
            } else {
                printf(__FILE__ "; LINE %d; File Not Exists.\n", __LINE__);
                std::cout << _attribute_file << std::endl;
                exit(1);
            }
        }
        const auto start = getCurrentTime();
        // create temporary graph
        std::vector<Edge> edges(numOfEdges);
        if (std::FILE *f = std::fopen(_graph_file.c_str(), "rb")) {
            size_t rtn = std::fread(edges.data(), sizeof edges[0], edges.size(), f);
            printf("Returned Value of fread: %zu\n", rtn);
            std::fclose(f);
        } else {
            printf("Graph::read; File Not Exists.\n");
            std::cout << _graph_file << std::endl;
            exit(1);
        }
        const auto end = getCurrentTime();
        printf("Time Used For Loading BINARY : %.2f\n", end - start);

        // read the edges
        // the ids must be in the range from [0 .... the number of vertices - 1];
        numOfEdges = 0;
        out_degrees.clear();
        out_degrees.resize(numOfVertices + 2, 0);
        in_degrees.clear();
        in_degrees.resize(numOfVertices + 2, 0);
        for (auto &edge : edges) {
            const VertexIdType &from_id = edge.from_id;
            const VertexIdType &to_id = edge.to_id;
            // remove self loop
            if (from_id != to_id) {
                //the edge read is a directed one
                ++out_degrees[from_id];
                ++in_degrees[to_id];
                ++numOfEdges;
            }
        }
        /* final count */
//        printf("%d-th Directed Edge Processed.\n", numOfEdges);

        // sort the adj list
//        for (auto &neighbors : matrix) {
//            std::sort(neighbors.begin(), neighbors.end());
//        }

        // process the dead_end
        uint32_t degree_max = 0;
        deadend_vertices.clear();
        for (VertexIdType i = 0; i < numOfVertices; ++i) {
            if (out_degrees[i] == 0) {
                deadend_vertices.emplace_back(i);
            }
            degree_max = std::max(degree_max, out_degrees[i]);
        }
        num_deadend_vertices = deadend_vertices.size();
        printf("The number of dead end vertices:%d\n", num_deadend_vertices);

        // process pos_list list
        start_pos_in_appearance_pos_lists.clear();
        start_pos_in_appearance_pos_lists.resize(numOfVertices + 2, 0);
        for (VertexIdType i = 0, j = 1; j < numOfVertices; ++i, ++j) {
            start_pos_in_appearance_pos_lists[j] = start_pos_in_appearance_pos_lists[i] + in_degrees[i];
        }
        start_pos_in_appearance_pos_lists[numOfVertices] = numOfEdges;

        // process out list
        start_pos_in_out_neighbor_lists.clear();
        start_pos_in_out_neighbor_lists.resize(numOfVertices + 2, 0);
        for (VertexIdType current_id = 0, next_id = 1; next_id < numOfVertices + 1; ++current_id, ++next_id) {
            start_pos_in_out_neighbor_lists[next_id] =
                    start_pos_in_out_neighbor_lists[current_id] + std::max(out_degrees[current_id], 1u);
        }
        // process dummy vertex
        assert(start_pos_in_out_neighbor_lists[numOfVertices] == numOfEdges + deadend_vertices.size());
        out_degrees[dummy_id] = 0;
        start_pos_in_out_neighbor_lists[numOfVertices + 1] = start_pos_in_out_neighbor_lists[numOfVertices];
        ////////////////////////////////////////////////////////////

        // compute the positions
        std::vector<VertexIdType> out_positions_to_fill(start_pos_in_out_neighbor_lists.begin(),
                                                        start_pos_in_out_neighbor_lists.end());
        // fill the edge list
        out_neighbors_lists.clear();
        out_neighbors_lists.resize(numOfEdges + num_deadend_vertices + degree_max, 0);
        uint32_t edges_processed = 0;
        uint32_t msg_gap = std::max(1u, numOfEdges / 10);
        std::vector<std::pair<VertexIdType, VertexIdType>> position_pair;
        position_pair.reserve(numOfEdges);
        for (auto &edge : edges) {
            const VertexIdType &from_id = edge.from_id;
            const VertexIdType &to_id = edge.to_id;
            // remove self loop
            if (from_id != to_id) {
                VertexIdType &out_position = out_positions_to_fill[from_id];
                assert(out_position < out_positions_to_fill[from_id + 1]);
                out_neighbors_lists[out_position] = to_id;
                position_pair.emplace_back(to_id, out_position);
                ++out_position;
                if (++edges_processed % msg_gap == 0) {
                    printf("%u edges processed.\n", edges_processed);
                }
            }
        }
        edges.clear();
        MSG(edges_processed);
        printf("%s\n", std::string(30, '-').c_str());
#ifdef USE_REVERSE_POS
        std::vector<VertexIdType> in_positions_to_fill(start_pos_in_appearance_pos_lists.begin(),
                                                       start_pos_in_appearance_pos_lists.end());
        in_positions_to_fill[numOfVertices] = numOfEdges;
        const double time_sort_start = getCurrentTime();
        std::sort(position_pair.begin(), position_pair.end(), std::less<>());
        const double time_sort_end = getCurrentTime();
//        MSG(time_sort_end - time_sort_start);
        printf("%s\n", std::string(30, '-').c_str());
        appearance_pos_lists.clear();
        appearance_pos_lists.resize(numOfEdges + num_deadend_vertices + degree_max, 0);
        uint32_t in_pos_pair = 0;
        for (const auto &pair : position_pair) {
            const VertexIdType &to_id = pair.first;
            const VertexIdType &pos = pair.second;
            VertexIdType &in_position = in_positions_to_fill[to_id];
            assert(in_position < in_positions_to_fill[to_id + 1]);
            appearance_pos_lists[in_position] = pos;
            ++in_position;
            if (++in_pos_pair % msg_gap == 0) {
                MSG(in_pos_pair);
            }
        }
#endif

        // fill the dummy ids
        for (const VertexIdType &id : deadend_vertices) {
            out_neighbors_lists[out_positions_to_fill[id]++] = dummy_id;
        }

#ifdef DEBUG_MODE
//        show();
        // sanity check
//        std::memcpy(in_positions_to_fill.data(), start_pos_in_appearance_pos_lists.data(),
//                    sizeof(VertexIdType) * numOfVertices);
//        for (uint32_t index = 0; index < numOfEdges + num_deadend_vertices; ++index) {
//            const VertexIdType id = out_neighbors_lists[index];
//            if (id != numOfVertices) {
//                VertexIdType &in_position = in_positions_to_fill[id];
//                if (appearance_pos_lists[in_position] != index) {
//                    printf("Error in " __FILE__  ", line %d, in position error.\n", __LINE__);
//                    MSG(index);
//                    MSG(id);
//                    MSG(in_position);
//                    exit(1);
//                }
//                ++in_position;
//            }
//        }
#endif
        const double time_end = getCurrentTime();
        printf("Graph Build Finished. TIME: %.4f\n", time_end - start);
        printf("%s\n", std::string(110, '-').c_str());

    }